

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O1

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::delete_old_
          (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  size_type sVar4;
  int iVar5;
  filename_t *pfVar6;
  int *piVar7;
  pointer pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  type old_filename;
  filename_t current_file;
  filename_t local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pfVar6 = details::file_helper::filename_abi_cxx11_(&this->file_helper_);
  pcVar2 = (pfVar6->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + pfVar6->_M_string_length);
  uVar3 = (this->filenames_q_).max_items_;
  if ((uVar3 != 0) && (((this->filenames_q_).tail_ + 1) % uVar3 == (this->filenames_q_).head_)) {
    sVar4 = (this->filenames_q_).head_;
    pbVar8 = (this->filenames_q_).v_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = pbVar8 + sVar4;
    pbVar8 = pbVar8 + sVar4;
    paVar9 = &pbVar8->field_2;
    local_a0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar9) {
      local_a0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_a0._M_string_length = pbVar1->_M_string_length;
    (pbVar1->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar1->_M_string_length = 0;
    (pbVar1->field_2)._M_local_buf[0] = '\0';
    (this->filenames_q_).head_ = ((this->filenames_q_).head_ + 1) % (this->filenames_q_).max_items_;
    iVar5 = details::os::remove_if_exists(&local_a0);
    if (iVar5 != 0) {
      details::
      circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      push_back(&this->filenames_q_,&local_80);
      details::os::filename_to_str(&local_60,&local_a0);
      std::operator+(&local_40,"Failed removing daily file ",&local_60);
      piVar7 = __errno_location();
      throw_spdlog_ex(&local_40,*piVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  details::
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push_back(&this->filenames_q_,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void delete_old_()
    {
        using details::os::filename_to_str;
        using details::os::remove_if_exists;

        filename_t current_file = file_helper_.filename();
        if (filenames_q_.full())
        {
            auto old_filename = std::move(filenames_q_.front());
            filenames_q_.pop_front();
            bool ok = remove_if_exists(old_filename) == 0;
            if (!ok)
            {
                filenames_q_.push_back(std::move(current_file));
                throw_spdlog_ex("Failed removing daily file " + filename_to_str(old_filename), errno);
            }
        }
        filenames_q_.push_back(std::move(current_file));
    }